

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeAddContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  _xmlDoc *p_Var2;
  int iVar3;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar4;
  
  if (cur == (xmlNodePtr)0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if ((0 < len && content != (xmlChar *)0x0) &&
       (xVar1 = cur->type, iVar3 = 0, xVar1 < XML_NOTATION_NODE)) {
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
        iVar3 = xmlTextAddContent(cur,content,len);
        return iVar3;
      }
      if ((0x802U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
        p_Var2 = cur->doc;
        cur_00 = xmlNewTextLen(content,len);
        if (cur_00 != (xmlNodePtr)0x0) {
          cur_00->doc = p_Var2;
          pxVar4 = xmlAddChild(cur,cur_00);
          if (pxVar4 != (xmlNodePtr)0x0) {
            return 0;
          }
          xmlFreeNode(cur_00);
        }
        iVar3 = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlNodeAddContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL)
	return(1);
    if ((content == NULL) || (len <= 0))
        return(0);

    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE: {
	    xmlNodePtr newNode, tmp;

	    newNode = xmlNewDocTextLen(cur->doc, content, len);
	    if (newNode == NULL)
                return(-1);
            tmp = xmlAddChild(cur, newNode);
            if (tmp == NULL) {
                xmlFreeNode(newNode);
                return(-1);
            }
	    break;
	}
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            return(xmlTextAddContent(cur, content, len));
        default:
            break;
    }

    return(0);
}